

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureFilteringTests.cpp
# Opt level: O0

int __thiscall
deqp::gles3::Functional::Texture2DArrayFilteringCase::init
          (Texture2DArrayFilteringCase *this,EVP_PKEY_CTX *ctx)

{
  deUint32 z;
  int iVar1;
  int iVar2;
  int iVar3;
  int extraout_EAX;
  Texture2DArray *pTVar4;
  RenderContext *pRVar5;
  Texture2DArray *pTVar6;
  PixelBufferAccess *pPVar7;
  int *piVar8;
  RenderTarget *this_00;
  Vector<float,_2> local_370;
  Vector<float,_2> local_368;
  Vector<float,_2> local_360;
  FilterCase local_358;
  Vector<float,_2> local_338;
  Vector<float,_2> local_330;
  Vector<float,_2> local_328;
  FilterCase local_320;
  Vector<float,_2> local_300;
  Vector<float,_2> local_2f8;
  Vector<float,_2> local_2f0;
  FilterCase local_2e8;
  Vector<float,_2> local_2c8;
  Vector<float,_2> local_2c0;
  Vector<float,_2> local_2b8;
  FilterCase local_2b0;
  RGBA local_290;
  Vector<float,_4> local_28c;
  Vector<float,_4> local_27c;
  Vec4 local_26c;
  RGBA local_25c;
  Vector<float,_4> local_258;
  Vector<float,_4> local_248;
  Vec4 local_238;
  PixelBufferAccess local_228;
  uint local_1fc;
  uint local_1f8;
  deUint32 colorB;
  deUint32 colorA;
  deUint32 rgb;
  deUint32 step;
  int layerNdx_1;
  PixelBufferAccess levelBuf_1;
  int levelNdx_1;
  Vector<float,_4> local_18c;
  Vector<float,_4> local_17c;
  Vector<float,_4> local_16c;
  undefined1 local_15c [8];
  Vec4 gMax;
  Vector<float,_4> local_13c;
  Vector<float,_4> local_12c;
  undefined1 local_11c [8];
  Vec4 gMin;
  IVec4 swz;
  int layerNdx;
  PixelBufferAccess levelBuf;
  undefined1 local_c8 [4];
  int levelNdx;
  IVec4 levelSwz [4];
  int numLevels;
  Vec4 cBias;
  Vec4 cScale;
  TextureFormatInfo fmtInfo;
  TextureFormat local_18;
  TextureFormat texFmt;
  Texture2DArrayFilteringCase *this_local;
  
  texFmt = (TextureFormat)this;
  local_18 = glu::mapGLInternalFormat(this->m_internalFormat);
  tcu::getTextureFormatInfo((TextureFormatInfo *)(cScale.m_data + 2),&local_18);
  tcu::operator-((tcu *)(cBias.m_data + 2),(Vector<float,_4> *)(fmtInfo.valueMin.m_data + 2),
                 (Vector<float,_4> *)(cScale.m_data + 2));
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(levelSwz[3].m_data + 3),(Vector<float,_4> *)(cScale.m_data + 2));
  iVar1 = de::max<int>(this->m_width,this->m_height);
  iVar1 = deLog2Floor32(iVar1);
  levelSwz[3].m_data[2] = iVar1 + 1;
  pTVar4 = (Texture2DArray *)operator_new(0x70);
  pRVar5 = Context::getRenderContext((this->super_TestCase).m_context);
  glu::Texture2DArray::Texture2DArray
            (pTVar4,pRVar5,this->m_internalFormat,this->m_width,this->m_height,this->m_numLayers);
  this->m_gradientTex = pTVar4;
  pTVar4 = (Texture2DArray *)operator_new(0x70);
  pRVar5 = Context::getRenderContext((this->super_TestCase).m_context);
  glu::Texture2DArray::Texture2DArray
            (pTVar4,pRVar5,this->m_internalFormat,this->m_width,this->m_height,this->m_numLayers);
  this->m_gridTex = pTVar4;
  tcu::Vector<int,_4>::Vector((Vector<int,_4> *)local_c8,0,1,2,3);
  tcu::Vector<int,_4>::Vector((Vector<int,_4> *)(levelSwz[0].m_data + 2),2,1,3,0);
  tcu::Vector<int,_4>::Vector((Vector<int,_4> *)(levelSwz[1].m_data + 2),3,0,1,2);
  tcu::Vector<int,_4>::Vector((Vector<int,_4> *)(levelSwz[2].m_data + 2),1,3,2,0);
  for (levelBuf.super_ConstPixelBufferAccess.m_data._4_4_ = 0;
      levelBuf.super_ConstPixelBufferAccess.m_data._4_4_ < levelSwz[3].m_data[2];
      levelBuf.super_ConstPixelBufferAccess.m_data._4_4_ =
           levelBuf.super_ConstPixelBufferAccess.m_data._4_4_ + 1) {
    pTVar6 = glu::Texture2DArray::getRefTexture(this->m_gradientTex);
    tcu::Texture2DArray::allocLevel(pTVar6,levelBuf.super_ConstPixelBufferAccess.m_data._4_4_);
    pTVar6 = glu::Texture2DArray::getRefTexture(this->m_gradientTex);
    pPVar7 = tcu::TextureLevelPyramid::getLevel
                       (&pTVar6->super_TextureLevelPyramid,
                        levelBuf.super_ConstPixelBufferAccess.m_data._4_4_);
    tcu::PixelBufferAccess::PixelBufferAccess((PixelBufferAccess *)(swz.m_data + 3),pPVar7);
    for (swz.m_data[2] = 0; swz.m_data[2] < this->m_numLayers; swz.m_data[2] = swz.m_data[2] + 1) {
      tcu::Vector<int,_4>::Vector
                ((Vector<int,_4> *)(gMin.m_data + 2),
                 (Vector<int,_4> *)(local_c8 + (long)(swz.m_data[2] % 4) * 0x10));
      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(gMax.m_data + 2),0.0,0.0,0.0,1.0);
      piVar8 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)(gMin.m_data + 2),0);
      iVar1 = *piVar8;
      piVar8 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)(gMin.m_data + 2),1);
      iVar2 = *piVar8;
      piVar8 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)(gMin.m_data + 2),2);
      iVar3 = *piVar8;
      tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)(gMin.m_data + 2),3);
      tcu::Vector<float,_4>::swizzle(&local_13c,(int)&gMax + 8,iVar1,iVar2,iVar3);
      tcu::operator*((tcu *)&local_12c,&local_13c,(Vector<float,_4> *)(cBias.m_data + 2));
      tcu::operator+((tcu *)local_11c,&local_12c,(Vector<float,_4> *)(levelSwz[3].m_data + 3));
      tcu::Vector<float,_4>::Vector(&local_18c,1.0,1.0,1.0,0.0);
      piVar8 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)(gMin.m_data + 2),0);
      iVar1 = *piVar8;
      piVar8 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)(gMin.m_data + 2),1);
      iVar2 = *piVar8;
      piVar8 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)(gMin.m_data + 2),2);
      iVar3 = *piVar8;
      tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)(gMin.m_data + 2),3);
      tcu::Vector<float,_4>::swizzle(&local_17c,(int)&local_18c,iVar1,iVar2,iVar3);
      tcu::operator*((tcu *)&local_16c,&local_17c,(Vector<float,_4> *)(cBias.m_data + 2));
      tcu::operator+((tcu *)local_15c,&local_16c,(Vector<float,_4> *)(levelSwz[3].m_data + 3));
      iVar1 = swz.m_data[2];
      iVar2 = tcu::ConstPixelBufferAccess::getWidth((ConstPixelBufferAccess *)(swz.m_data + 3));
      iVar3 = tcu::ConstPixelBufferAccess::getHeight((ConstPixelBufferAccess *)(swz.m_data + 3));
      tcu::getSubregion((PixelBufferAccess *)&stack0xfffffffffffffe48,
                        (PixelBufferAccess *)(swz.m_data + 3),0,0,iVar1,iVar2,iVar3,1);
      tcu::fillWithComponentGradients
                ((PixelBufferAccess *)&stack0xfffffffffffffe48,(Vec4 *)local_11c,(Vec4 *)local_15c);
    }
  }
  for (levelBuf_1.super_ConstPixelBufferAccess.m_data._4_4_ = 0;
      levelBuf_1.super_ConstPixelBufferAccess.m_data._4_4_ < levelSwz[3].m_data[2];
      levelBuf_1.super_ConstPixelBufferAccess.m_data._4_4_ =
           levelBuf_1.super_ConstPixelBufferAccess.m_data._4_4_ + 1) {
    pTVar6 = glu::Texture2DArray::getRefTexture(this->m_gridTex);
    tcu::Texture2DArray::allocLevel(pTVar6,levelBuf_1.super_ConstPixelBufferAccess.m_data._4_4_);
    pTVar6 = glu::Texture2DArray::getRefTexture(this->m_gridTex);
    pPVar7 = tcu::TextureLevelPyramid::getLevel
                       (&pTVar6->super_TextureLevelPyramid,
                        levelBuf_1.super_ConstPixelBufferAccess.m_data._4_4_);
    tcu::PixelBufferAccess::PixelBufferAccess((PixelBufferAccess *)&step,pPVar7);
    for (rgb = 0; z = rgb, (int)rgb < this->m_numLayers; rgb = rgb + 1) {
      colorA = (deUint32)(0xffffff / (long)(levelSwz[3].m_data[2] * this->m_numLayers + -1));
      colorB = colorA * (levelBuf_1.super_ConstPixelBufferAccess.m_data._4_4_ +
                        rgb * levelSwz[3].m_data[2]);
      local_1f8 = colorB | 0xff000000;
      local_1fc = ~colorB | 0xff000000;
      iVar1 = tcu::ConstPixelBufferAccess::getWidth((ConstPixelBufferAccess *)&step);
      iVar2 = tcu::ConstPixelBufferAccess::getHeight((ConstPixelBufferAccess *)&step);
      tcu::getSubregion(&local_228,(PixelBufferAccess *)&step,0,0,z,iVar1,iVar2,1);
      tcu::RGBA::RGBA(&local_25c,local_1f8);
      tcu::RGBA::toVec((RGBA *)&local_258);
      tcu::operator*((tcu *)&local_248,&local_258,(Vector<float,_4> *)(cBias.m_data + 2));
      tcu::operator+((tcu *)&local_238,&local_248,(Vector<float,_4> *)(levelSwz[3].m_data + 3));
      tcu::RGBA::RGBA(&local_290,local_1fc);
      tcu::RGBA::toVec((RGBA *)&local_28c);
      tcu::operator*((tcu *)&local_27c,&local_28c,(Vector<float,_4> *)(cBias.m_data + 2));
      tcu::operator+((tcu *)&local_26c,&local_27c,(Vector<float,_4> *)(levelSwz[3].m_data + 3));
      tcu::fillWithGrid(&local_228,4,&local_238,&local_26c);
    }
  }
  glu::Texture2DArray::upload(this->m_gradientTex);
  glu::Texture2DArray::upload(this->m_gridTex);
  pTVar4 = this->m_gradientTex;
  tcu::Vector<float,_2>::Vector(&local_2b8,1.5,2.8);
  tcu::Vector<float,_2>::Vector(&local_2c0,-1.0,-2.7);
  tcu::Vector<float,_2>::Vector(&local_2c8,-0.5,(float)this->m_numLayers + 0.5);
  FilterCase::FilterCase(&local_2b0,pTVar4,&local_2b8,&local_2c0,&local_2c8);
  std::
  vector<deqp::gles3::Functional::Texture2DArrayFilteringCase::FilterCase,_std::allocator<deqp::gles3::Functional::Texture2DArrayFilteringCase::FilterCase>_>
  ::push_back(&this->m_cases,&local_2b0);
  pTVar4 = this->m_gridTex;
  tcu::Vector<float,_2>::Vector(&local_2f0,0.2,0.175);
  tcu::Vector<float,_2>::Vector(&local_2f8,-2.0,-3.7);
  tcu::Vector<float,_2>::Vector(&local_300,-0.5,(float)this->m_numLayers + 0.5);
  FilterCase::FilterCase(&local_2e8,pTVar4,&local_2f0,&local_2f8,&local_300);
  std::
  vector<deqp::gles3::Functional::Texture2DArrayFilteringCase::FilterCase,_std::allocator<deqp::gles3::Functional::Texture2DArrayFilteringCase::FilterCase>_>
  ::push_back(&this->m_cases,&local_2e8);
  pTVar4 = this->m_gridTex;
  tcu::Vector<float,_2>::Vector(&local_328,-0.8,-2.3);
  tcu::Vector<float,_2>::Vector(&local_330,0.2,-0.1);
  tcu::Vector<float,_2>::Vector(&local_338,(float)this->m_numLayers + 0.5,-0.5);
  FilterCase::FilterCase(&local_320,pTVar4,&local_328,&local_330,&local_338);
  std::
  vector<deqp::gles3::Functional::Texture2DArrayFilteringCase::FilterCase,_std::allocator<deqp::gles3::Functional::Texture2DArrayFilteringCase::FilterCase>_>
  ::push_back(&this->m_cases,&local_320);
  this_00 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar1 = tcu::RenderTarget::getNumSamples(this_00);
  if (iVar1 == 0) {
    pTVar4 = this->m_gradientTex;
    tcu::Vector<float,_2>::Vector(&local_360,-2.0,-1.5);
    tcu::Vector<float,_2>::Vector(&local_368,-0.1,0.9);
    tcu::Vector<float,_2>::Vector(&local_370,1.50001,1.49999);
    FilterCase::FilterCase(&local_358,pTVar4,&local_360,&local_368,&local_370);
    std::
    vector<deqp::gles3::Functional::Texture2DArrayFilteringCase::FilterCase,_std::allocator<deqp::gles3::Functional::Texture2DArrayFilteringCase::FilterCase>_>
    ::push_back(&this->m_cases,&local_358);
  }
  this->m_caseNdx = 0;
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
  return extraout_EAX;
}

Assistant:

void Texture2DArrayFilteringCase::init (void)
{
	try
	{
		const tcu::TextureFormat		texFmt		= glu::mapGLInternalFormat(m_internalFormat);
		const tcu::TextureFormatInfo	fmtInfo		= tcu::getTextureFormatInfo(texFmt);
		const tcu::Vec4					cScale		= fmtInfo.valueMax-fmtInfo.valueMin;
		const tcu::Vec4					cBias		= fmtInfo.valueMin;
		const int						numLevels	= deLog2Floor32(de::max(m_width, m_height)) + 1;

		// Create textures.
		m_gradientTex	= new glu::Texture2DArray(m_context.getRenderContext(), m_internalFormat, m_width, m_height, m_numLayers);
		m_gridTex		= new glu::Texture2DArray(m_context.getRenderContext(), m_internalFormat, m_width, m_height, m_numLayers);

		const tcu::IVec4 levelSwz[] =
		{
			tcu::IVec4(0,1,2,3),
			tcu::IVec4(2,1,3,0),
			tcu::IVec4(3,0,1,2),
			tcu::IVec4(1,3,2,0),
		};

		// Fill first gradient texture (gradient direction varies between layers).
		for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
		{
			m_gradientTex->getRefTexture().allocLevel(levelNdx);

			const tcu::PixelBufferAccess levelBuf = m_gradientTex->getRefTexture().getLevel(levelNdx);

			for (int layerNdx = 0; layerNdx < m_numLayers; layerNdx++)
			{
				const tcu::IVec4	swz		= levelSwz[layerNdx%DE_LENGTH_OF_ARRAY(levelSwz)];
				const tcu::Vec4		gMin	= tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f).swizzle(swz[0],swz[1],swz[2],swz[3])*cScale + cBias;
				const tcu::Vec4		gMax	= tcu::Vec4(1.0f, 1.0f, 1.0f, 0.0f).swizzle(swz[0],swz[1],swz[2],swz[3])*cScale + cBias;

				tcu::fillWithComponentGradients(tcu::getSubregion(levelBuf, 0, 0, layerNdx, levelBuf.getWidth(), levelBuf.getHeight(), 1), gMin, gMax);
			}
		}

		// Fill second with grid texture (each layer has unique colors).
		for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
		{
			m_gridTex->getRefTexture().allocLevel(levelNdx);

			const tcu::PixelBufferAccess levelBuf = m_gridTex->getRefTexture().getLevel(levelNdx);

			for (int layerNdx = 0; layerNdx < m_numLayers; layerNdx++)
			{
				const deUint32	step	= 0x00ffffff / (numLevels*m_numLayers - 1);
				const deUint32	rgb		= step * (levelNdx + layerNdx*numLevels);
				const deUint32	colorA	= 0xff000000 | rgb;
				const deUint32	colorB	= 0xff000000 | ~rgb;

				tcu::fillWithGrid(tcu::getSubregion(levelBuf, 0, 0, layerNdx, levelBuf.getWidth(), levelBuf.getHeight(), 1),
								  4, tcu::RGBA(colorA).toVec()*cScale + cBias, tcu::RGBA(colorB).toVec()*cScale + cBias);
			}
		}

		// Upload.
		m_gradientTex->upload();
		m_gridTex->upload();

		// Test cases
		m_cases.push_back(FilterCase(m_gradientTex,	tcu::Vec2( 1.5f,  2.8f  ),	tcu::Vec2(-1.0f, -2.7f), tcu::Vec2(-0.5f, float(m_numLayers)+0.5f)));
		m_cases.push_back(FilterCase(m_gridTex,		tcu::Vec2( 0.2f,  0.175f),	tcu::Vec2(-2.0f, -3.7f), tcu::Vec2(-0.5f, float(m_numLayers)+0.5f)));
		m_cases.push_back(FilterCase(m_gridTex,		tcu::Vec2(-0.8f, -2.3f  ),	tcu::Vec2( 0.2f, -0.1f), tcu::Vec2(float(m_numLayers)+0.5f, -0.5f)));

		// Level rounding - only in single-sample configs as multisample configs may produce smooth transition at the middle.
		if (m_context.getRenderTarget().getNumSamples() == 0)
			m_cases.push_back(FilterCase(m_gradientTex,	tcu::Vec2(-2.0f, -1.5f  ),	tcu::Vec2(-0.1f,  0.9f), tcu::Vec2(1.50001f, 1.49999f)));

		m_caseNdx = 0;
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	catch (...)
	{
		// Clean up to save memory.
		Texture2DArrayFilteringCase::deinit();
		throw;
	}
}